

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O3

void __thiscall helics::tcp::TcpComms::loadNetworkInfo(TcpComms *this,NetworkBrokerData *netInfo)

{
  bool bVar1;
  
  NetworkCommsInterface::loadNetworkInfo(&this->super_NetworkCommsInterface,netInfo);
  bVar1 = CommsInterface::propertyLock((CommsInterface *)this);
  if (bVar1) {
    this->reuse_address = netInfo->reuse_address;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &this->encryption_config,&netInfo->encryptionConfig);
    CommsInterface::propertyUnLock((CommsInterface *)this);
    return;
  }
  return;
}

Assistant:

void TcpComms::loadNetworkInfo(const NetworkBrokerData& netInfo)
{
    NetworkCommsInterface::loadNetworkInfo(netInfo);
    if (!propertyLock()) {
        return;
    }
    reuse_address = netInfo.reuse_address;
    encryption_config = netInfo.encryptionConfig;
    propertyUnLock();
}